

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  ostream *poVar1;
  byte bVar2;
  string *psVar3;
  uchar value;
  char *pcVar4;
  ulong uVar5;
  string local_60;
  string *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_40 = __return_storage_ptr__;
  Message::Message((Message *)&local_38);
  if (str->_M_string_length != 0) {
    poVar1 = (ostream *)(local_38.ptr_ + 0x10);
    uVar5 = 0;
    do {
      bVar2 = (str->_M_dataplus)._M_p[uVar5];
      pcVar4 = "\\t";
      switch(bVar2) {
      case 8:
        pcVar4 = "\\b";
        break;
      case 9:
        break;
      case 10:
        pcVar4 = "\\n";
        break;
      case 0xb:
switchD_00141023_caseD_b:
        if ((char)bVar2 < ' ') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\\u00",4);
          String::FormatByte_abi_cxx11_(&local_60,(String *)(ulong)bVar2,value);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                             (byte)local_60._M_dataplus._M_p),
                     local_60._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(byte)local_60._M_dataplus._M_p) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_60._M_dataplus._M_p._1_7_,(byte)local_60._M_dataplus._M_p
                                    ),local_60.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_60._M_dataplus._M_p._0_1_ = bVar2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
        }
        goto LAB_001410f3;
      case 0xc:
        pcVar4 = "\\f";
        break;
      case 0xd:
        pcVar4 = "\\r";
        break;
      default:
        if ((0x3a < bVar2 - 0x22) ||
           ((0x400000000002001U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0))
        goto switchD_00141023_caseD_b;
        local_60._M_dataplus._M_p._0_1_ = 0x5c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
        local_60._M_dataplus._M_p._0_1_ = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_60,1);
        goto LAB_001410f3;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,2);
LAB_001410f3:
      uVar5 = uVar5 + 1;
    } while (uVar5 < str->_M_string_length);
  }
  psVar3 = local_40;
  StringStreamToString(local_40,local_38.ptr_);
  if (local_38.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))(local_38.ptr_);
  }
  return psVar3;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}